

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O2

void __thiscall CBuildVisitor::Visit(CBuildVisitor *this,CIdExp *expression)

{
  element_type *peVar1;
  IAddress *pIVar2;
  ISubtreeWrapper *_wrapper;
  shared_ptr<VariableInfo> varInfo;
  
  std::operator<<((ostream *)&std::cout,"IRT builder: CIdExp\n");
  pIVar2 = IRT::CFrame::GetLocalVisibilityAddress(this->currentFrame,&expression->name);
  if (pIVar2 != (IAddress *)0x0) {
    _wrapper = (ISubtreeWrapper *)operator_new(0x10);
    (*pIVar2->_vptr_IAddress[2])(&varInfo,pIVar2);
    peVar1 = varInfo.super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    varInfo.super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    _wrapper->_vptr_ISubtreeWrapper = (_func_int **)&PTR_ToExpression_0017b478;
    _wrapper[1]._vptr_ISubtreeWrapper = (_func_int **)peVar1;
    updateSubtreeWrapper(this,_wrapper);
    if (varInfo.super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      (**(code **)(((varInfo.super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   name)._M_dataplus._M_p + 0x10))();
    }
    getVariableInfoFromLocalArgAndFields
              ((SymbolTable *)&varInfo,(string *)this->symbolTable,&this->currentClassName,
               &this->currentMethod);
    if ((((varInfo.super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type).
         super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->isPrimitive == true) {
      std::__cxx11::string::assign((char *)&this->currentObjectClassName);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&this->currentObjectClassName);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&varInfo.super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    return;
  }
  __assert_fail("address != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/visitors/CBuildVisitor.cpp"
                ,0x11,"virtual void CBuildVisitor::Visit(CIdExp &)");
}

Assistant:

void CBuildVisitor::Visit( CIdExp &expression ) {
    std::cout << "IRT builder: CIdExp\n";
    const IRT::IAddress *address = currentFrame->GetLocalVisibilityAddress( expression.name );

    assert( address != NULL );

    updateSubtreeWrapper( new IRT::CExpressionWrapper(
            std::move( address->ToExpression( ))
    ));

    auto varInfo = getVariableInfoFromLocalArgAndFields( symbolTable, currentClassName, currentMethod,
                                                         expression.name );
    if ( varInfo->type->isPrimitive ) {
        currentObjectClassName = "";
    } else {
        currentObjectClassName = varInfo->type->className;
    }
}